

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeBase *
ResolveGenericTypeAliases
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,IntrusiveList<MatchData> aliases)

{
  longlong length;
  IntrusiveList<TypeHandle> generics;
  bool bVar1;
  int iVar2;
  TypeUnsizedArray *pTVar3;
  TypeHandle *pTVar4;
  TypeBase *pTVar5;
  TypeRef *pTVar6;
  TypeArray *pTVar7;
  TypeBase *pTVar8;
  undefined4 extraout_var_00;
  TypeGenericClass *pTVar9;
  MatchData *pMVar10;
  char *msg;
  byte bVar11;
  undefined8 *puVar12;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> arguments;
  IntrusiveList<TypeHandle> local_48;
  TypeBase *local_38;
  undefined4 extraout_var;
  
  pMVar10 = aliases.head;
  if ((pMVar10 != (MatchData *)0x0 & type->isGeneric) == 1) {
    switch(type->typeID) {
    case 0xc:
      break;
    case 0xd:
      do {
        bVar1 = InplaceStr::operator==
                          (&pMVar10->name->name,(InplaceStr *)(type[1]._vptr_TypeBase + 8));
        if (bVar1) {
          return pMVar10->type;
        }
        pMVar10 = pMVar10->next;
      } while (pMVar10 != (MatchData *)0x0);
      type = ctx->typeGeneric;
      break;
    default:
      msg = "ERROR: unknown generic type resolve";
LAB_001704a0:
      anon_unknown.dwarf_c3752::Stop(ctx,source,msg);
    case 0x12:
      pTVar8 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)type[1]._vptr_TypeBase,aliases);
      pTVar6 = ExpressionContext::GetReferenceType(ctx,pTVar8);
      return &pTVar6->super_TypeBase;
    case 0x13:
      pTVar8 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)type[1]._vptr_TypeBase,aliases);
      length._0_4_ = type[1].typeID;
      length._4_4_ = type[1].nameHash;
      pTVar7 = ExpressionContext::GetArrayType(ctx,pTVar8,length);
      return &pTVar7->super_TypeBase;
    case 0x14:
      pTVar8 = ResolveGenericTypeAliases(ctx,source,*(TypeBase **)&type[1].typeIndex,aliases);
      pTVar3 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar8);
      return (TypeBase *)pTVar3;
    case 0x15:
      pTVar8 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)type[1]._vptr_TypeBase,aliases);
      local_48.head = (TypeHandle *)0x0;
      local_48.tail = (TypeHandle *)0x0;
      for (puVar12 = *(undefined8 **)&type[1].typeID; puVar12 != (undefined8 *)0x0;
          puVar12 = (undefined8 *)puVar12[1]) {
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pTVar4 = (TypeHandle *)CONCAT44(extraout_var,iVar2);
        pTVar5 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)*puVar12,aliases);
        pTVar4->type = pTVar5;
        pTVar4->next = (TypeHandle *)0x0;
        pTVar4->listed = false;
        IntrusiveList<TypeHandle>::push_back(&local_48,pTVar4);
      }
      arguments_00.tail = local_48.tail;
      arguments_00.head = local_48.head;
      type = &ExpressionContext::GetFunctionType(ctx,source,pTVar8,arguments_00)->super_TypeBase;
      break;
    case 0x17:
      local_48.head = (TypeHandle *)0x0;
      local_48.tail = (TypeHandle *)0x0;
      puVar12 = *(undefined8 **)&type[1].typeID;
      if (puVar12 != (undefined8 *)0x0) {
        bVar11 = 0;
        local_38 = type;
        do {
          pTVar8 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)*puVar12,aliases);
          if (pTVar8 == ctx->typeAuto) {
            msg = "ERROR: \'auto\' type cannot be used as template argument";
            goto LAB_001704a0;
          }
          bVar11 = bVar11 & 1 | pTVar8->isGeneric;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pTVar4 = (TypeHandle *)CONCAT44(extraout_var_00,iVar2);
          pTVar4->type = pTVar8;
          pTVar4->next = (TypeHandle *)0x0;
          pTVar4->listed = false;
          IntrusiveList<TypeHandle>::push_back(&local_48,pTVar4);
          puVar12 = (undefined8 *)puVar12[1];
        } while (puVar12 != (undefined8 *)0x0);
        type = local_38;
        if (bVar11 != 0) {
          generics.tail = local_48.tail;
          generics.head = local_48.head;
          pTVar9 = ExpressionContext::GetGenericClassType
                             (ctx,source,(TypeGenericClassProto *)local_38[1]._vptr_TypeBase,
                              generics);
          return &pTVar9->super_TypeBase;
        }
      }
      type = CreateGenericTypeInstance
                       (ctx,source,(TypeGenericClassProto *)type[1]._vptr_TypeBase,&local_48);
    }
  }
  return &((TypeFunction *)type)->super_TypeBase;
}

Assistant:

TypeBase* ResolveGenericTypeAliases(ExpressionContext &ctx, SynBase *source, TypeBase *type, IntrusiveList<MatchData> aliases)
{
	if(!type->isGeneric || aliases.empty())
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(isType<TypeGeneric>(type))
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(type))
	{
		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
				return curr->type;
		}

		return ctx.typeGeneric;
	}

	if(TypeRef *lhs = getType<TypeRef>(type))
		return ctx.GetReferenceType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeArray *lhs = getType<TypeArray>(type))
		return ctx.GetArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases), lhs->length);

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(type))
		return ctx.GetUnsizedArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeFunction *lhs = getType<TypeFunction>(type))
	{
		TypeBase *returnType = ResolveGenericTypeAliases(ctx, source, lhs->returnType, aliases);

		IntrusiveList<TypeHandle> arguments;

		for(TypeHandle *curr = lhs->arguments.head; curr; curr = curr->next)
			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ResolveGenericTypeAliases(ctx, source, curr->type, aliases)));

		return ctx.GetFunctionType(source, returnType, arguments);
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(type))
	{
		bool isGeneric = false;
		IntrusiveList<TypeHandle> types;

		for(TypeHandle *curr = lhs->generics.head; curr; curr = curr->next)
		{
			TypeBase *resolvedType = ResolveGenericTypeAliases(ctx, source, curr->type, aliases);

			if(resolvedType == ctx.typeAuto)
				Stop(ctx, source, "ERROR: 'auto' type cannot be used as template argument");

			isGeneric |= resolvedType->isGeneric;

			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(resolvedType));
		}

		if(isGeneric)
			return ctx.GetGenericClassType(source, lhs->proto, types);

		return CreateGenericTypeInstance(ctx, source, lhs->proto, types);
	}

	Stop(ctx, source, "ERROR: unknown generic type resolve");

	return NULL;
}